

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfm.cpp
# Opt level: O1

void embree::skipSpacesAndComments(fstream *file)

{
  char cVar1;
  int iVar2;
  string line;
  undefined1 *local_38;
  undefined8 local_30;
  undefined1 local_28 [16];
  
  while( true ) {
    while( true ) {
      iVar2 = std::istream::peek();
      iVar2 = isspace(iVar2);
      if (iVar2 == 0) break;
      std::istream::ignore();
    }
    iVar2 = std::istream::peek();
    if (iVar2 != 0x23) break;
    local_30 = 0;
    local_28[0] = 0;
    local_38 = local_28;
    cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)file + -0x18) + (char)file);
    std::getline<char,std::char_traits<char>,std::allocator<char>>
              ((istream *)file,(string *)&local_38,cVar1);
    if (local_38 != local_28) {
      operator_delete(local_38);
    }
  }
  return;
}

Assistant:

static void skipSpacesAndComments(std::fstream& file)
  {
    while (true)
    {
      if  (isspace(file.peek())) {
        file.ignore();
      } else  if (file.peek() == '#') {
        std::string line; std::getline(file,line);
      } else break;
    }
  }